

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfastlatinbuilder.cpp
# Opt level: O0

UBool __thiscall
icu_63::CollationFastLatinBuilder::inSameGroup
          (CollationFastLatinBuilder *this,uint32_t p,uint32_t q)

{
  uint uVar1;
  int local_28;
  uint32_t lastPrimary;
  int32_t i;
  uint32_t lastVariablePrimary;
  uint32_t q_local;
  uint32_t p_local;
  CollationFastLatinBuilder *this_local;
  
  if (p < this->firstShortPrimary) {
    if (q < this->firstShortPrimary) {
      uVar1 = this->lastSpecialPrimaries[3];
      if (uVar1 < p) {
        this_local._7_1_ = uVar1 < q;
      }
      else if (uVar1 < q) {
        this_local._7_1_ = false;
      }
      else {
        for (local_28 = 0; uVar1 = this->lastSpecialPrimaries[local_28], uVar1 < p;
            local_28 = local_28 + 1) {
          if (q <= uVar1) {
            return '\0';
          }
        }
        this_local._7_1_ = q <= uVar1;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = this->firstShortPrimary <= q;
  }
  return this_local._7_1_;
}

Assistant:

UBool
CollationFastLatinBuilder::inSameGroup(uint32_t p, uint32_t q) const {
    // Both or neither need to be encoded as short primaries,
    // so that we can test only one and use the same bit mask.
    if(p >= firstShortPrimary) {
        return q >= firstShortPrimary;
    } else if(q >= firstShortPrimary) {
        return FALSE;
    }
    // Both or neither must be potentially-variable,
    // so that we can test only one and determine if both are variable.
    uint32_t lastVariablePrimary = lastSpecialPrimaries[NUM_SPECIAL_GROUPS - 1];
    if(p > lastVariablePrimary) {
        return q > lastVariablePrimary;
    } else if(q > lastVariablePrimary) {
        return FALSE;
    }
    // Both will be encoded with long mini primaries.
    // They must be in the same special reordering group,
    // so that we can test only one and determine if both are variable.
    U_ASSERT(p != 0 && q != 0);
    for(int32_t i = 0;; ++i) {  // will terminate
        uint32_t lastPrimary = lastSpecialPrimaries[i];
        if(p <= lastPrimary) {
            return q <= lastPrimary;
        } else if(q <= lastPrimary) {
            return FALSE;
        }
    }
}